

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Core.cpp
# Opt level: O0

void __thiscall
IRCCorePlugin::OnGenericCommandRemove(IRCCorePlugin *this,GenericCommand *in_command)

{
  bool bVar1;
  reference this_00;
  unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>
  *puVar2;
  const_iterator local_30;
  __normal_iterator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_*,_std::vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>_>
  local_28;
  __normal_iterator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_*,_std::vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>_>
  local_20;
  iterator itr;
  GenericCommand *in_command_local;
  IRCCorePlugin *this_local;
  
  itr._M_current =
       (unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>
        *)in_command;
  local_20._M_current =
       (unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>
        *)std::
          vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>
          ::begin(&this->m_wrapped_commands);
  while( true ) {
    local_28._M_current =
         (unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>
          *)std::
            vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>
            ::end(&this->m_wrapped_commands);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_*,_std::vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>_>
                      (&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_*,_std::vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>_>
              ::operator*(&local_20);
    std::
    unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>
    ::operator->(this_00);
    puVar2 = (unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>
              *)GenericCommandWrapperIRCCommand::getGenericCommand();
    if (puVar2 == itr._M_current) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_*,_std::vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>_>
    ::operator++(&local_20);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<GenericCommandWrapperIRCCommand,std::default_delete<GenericCommandWrapperIRCCommand>>const*,std::vector<std::unique_ptr<GenericCommandWrapperIRCCommand,std::default_delete<GenericCommandWrapperIRCCommand>>,std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,std::default_delete<GenericCommandWrapperIRCCommand>>>>>
  ::
  __normal_iterator<std::unique_ptr<GenericCommandWrapperIRCCommand,std::default_delete<GenericCommandWrapperIRCCommand>>*>
            ((__normal_iterator<std::unique_ptr<GenericCommandWrapperIRCCommand,std::default_delete<GenericCommandWrapperIRCCommand>>const*,std::vector<std::unique_ptr<GenericCommandWrapperIRCCommand,std::default_delete<GenericCommandWrapperIRCCommand>>,std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,std::default_delete<GenericCommandWrapperIRCCommand>>>>>
              *)&local_30,&local_20);
  std::
  vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>
  ::erase(&this->m_wrapped_commands,local_30);
  return;
}

Assistant:

void IRCCorePlugin::OnGenericCommandRemove(Jupiter::GenericCommand &in_command) {
	for (auto itr = m_wrapped_commands.begin(); itr != m_wrapped_commands.end(); ++itr) {
		if (&(*itr)->getGenericCommand() == &in_command) {
			m_wrapped_commands.erase(itr);
			return;
		}
	}
}